

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,Msk3Header *header)

{
  int iVar1;
  Msk3Header *in_RDI;
  int version;
  istream *unaff_retaddr;
  
  iVar1 = detectSwitch((istream *)header);
  if (iVar1 < 0) {
    readMsk3<Msk3HeaderPS3>(unaff_retaddr,in_RDI);
  }
  else {
    readMsk3<Msk3HeaderSwitch>(stream,header);
  }
  return (istream *)in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk3Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readMsk3<Msk3HeaderPS3>(stream, header);
	} else { // Switch
		readMsk3<Msk3HeaderSwitch>(stream, header);
	}
	return stream;
}